

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O1

_Bool testbinaryfuse8(size_t size)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t *keys;
  clock_t cVar6;
  clock_t cVar7;
  uint64_t uVar8;
  uint size_00;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  binary_fuse8_t filter;
  binary_fuse8_t local_58;
  
  printf("testing binary fuse8 ");
  printf("size = %zu \n",size);
  size_00 = (uint)size;
  local_58.Size = size_00;
  uVar11 = size & 0xffffffff;
  if (size_00 == 0) {
    uVar3 = 4;
  }
  else {
    dVar12 = log((double)uVar11);
    dVar12 = floor(dVar12 / 1.2029723039923526 + 2.25);
    uVar3 = 1 << ((byte)(long)dVar12 & 0x1f);
  }
  uVar10 = 0x40000;
  if (uVar3 < 0x40000) {
    uVar10 = uVar3;
  }
  local_58.SegmentLength = uVar10;
  local_58.SegmentLengthMask = uVar10 - 1;
  dVar12 = 0.0;
  if (1 < size_00) {
    dVar12 = log((double)uVar11);
    dVar12 = 3.4538776394910684 / dVar12 + 0.875;
    if (dVar12 <= 1.125) {
      dVar12 = 1.125;
    }
  }
  iVar4 = 0;
  if (1 < size_00) {
    dVar12 = round(dVar12 * (double)uVar11);
    iVar4 = (int)(long)dVar12;
  }
  uVar3 = ((-uVar10 & (iVar4 + uVar10) - 1) + (uVar10 - 1)) / uVar10;
  uVar5 = 1;
  if (2 < uVar3) {
    uVar5 = uVar3 - 2;
  }
  local_58.SegmentCount = uVar5;
  local_58.ArrayLength = (uVar5 + 2) * uVar10;
  local_58.SegmentCountLength = uVar5 * uVar10;
  local_58.Fingerprints = (uint8_t *)calloc((ulong)local_58.ArrayLength,1);
  keys = (uint64_t *)malloc(size * 8);
  auVar1 = _DAT_00107060;
  if (size != 0) {
    lVar9 = size - 1;
    auVar13._8_4_ = (int)lVar9;
    auVar13._0_8_ = lVar9;
    auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar8 = 0;
    auVar13 = auVar13 ^ _DAT_00107060;
    auVar14 = _DAT_00107050;
    do {
      auVar15 = auVar14 ^ auVar1;
      if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                  auVar13._4_4_ < auVar15._4_4_) & 1)) {
        keys[uVar8] = uVar8;
      }
      if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
          auVar15._12_4_ <= auVar13._12_4_) {
        keys[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar9 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar9 + 2;
    } while ((size + 1 & 0xfffffffffffffffe) != uVar8);
  }
  _Var2 = binary_fuse8_populate(keys,size_00,&local_58);
  if (_Var2) {
    lVar9 = 5;
    do {
      cVar6 = clock();
      binary_fuse8_populate(keys,size_00,&local_58);
      cVar7 = clock();
      printf("It took %f seconds to build an index over %zu values. \n",
             (double)(cVar7 - cVar6) / 1000000.0,size);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    free(local_58.Fingerprints);
    local_58.SegmentLengthMask = 0;
    local_58.SegmentCount = 0;
    local_58.SegmentCountLength = 0;
    local_58.ArrayLength = 0;
    local_58.Seed = 0;
    local_58.Size = 0;
    local_58.SegmentLength = 0;
    local_58.Fingerprints = (uint8_t *)0x0;
    free(keys);
  }
  return _Var2;
}

Assistant:

bool testbinaryfuse8(size_t size) {
  printf("testing binary fuse8 ");
  printf("size = %zu \n", size);

  binary_fuse8_t filter;

  binary_fuse8_allocate((uint32_t)size, &filter);
  // we need some set of values
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i; // we use contiguous values
  }
  // we construct the filter
  bool constructed = binary_fuse8_populate(big_set, (uint32_t)size, &filter); // warm the cache
  if(!constructed) { return false; }
  for (size_t times = 0; times < 5; times++) {
    clock_t t;
    t = clock();
    binary_fuse8_populate(big_set, (uint32_t)size, &filter);
    t = clock() - t;
    double time_taken = ((double)t) / CLOCKS_PER_SEC; // in seconds
    printf("It took %f seconds to build an index over %zu values. \n",
           time_taken, size);
  }
  binary_fuse8_free(&filter);
  free(big_set);
  return true;
}